

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ShowMetricsWindow(bool *p_open)

{
  ImVector<ImGuiPopupRef> *this;
  float fVar1;
  uint uVar2;
  uint uVar3;
  ImGuiWindow *pIVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  ImGuiIO *pIVar7;
  value_type *ppIVar8;
  value_type *pvVar9;
  char *pcVar10;
  char *label;
  char *pcVar11;
  int i_1;
  char *pcVar12;
  int i;
  int iVar13;
  
  bVar6 = Begin("ImGui Metrics",p_open,0);
  if (bVar6) {
    iVar13 = 0;
    Text("Dear ImGui %s","1.62 WIP");
    pIVar7 = GetIO();
    fVar1 = pIVar7->Framerate;
    pIVar7 = GetIO();
    Text("Application average %.3f ms/frame (%.1f FPS)",(double)(1000.0 / fVar1),
         (double)pIVar7->Framerate);
    pIVar7 = GetIO();
    uVar2 = pIVar7->MetricsRenderVertices;
    pIVar7 = GetIO();
    uVar3 = pIVar7->MetricsRenderIndices;
    pIVar7 = GetIO();
    Text("%d vertices, %d indices (%d triangles)",(ulong)uVar2,(ulong)uVar3,
         (long)pIVar7->MetricsRenderIndices / 3 & 0xffffffff);
    Text("%d allocations",(ulong)(uint)GImAllocatorActiveAllocationsCount);
    Checkbox("Show clipping rectangles when hovering draw commands",
             &ShowMetricsWindow::show_draw_cmd_clip_rects);
    Separator();
    pIVar5 = GImGui;
    ShowMetricsWindow::Funcs::NodeWindows(&GImGui->Windows,"Windows");
    bVar6 = TreeNode("DrawList","Active DrawLists (%d)",
                     (ulong)(uint)(pIVar5->DrawDataBuilder).Layers[0].Size);
    if (bVar6) {
      for (; iVar13 < (pIVar5->DrawDataBuilder).Layers[0].Size; iVar13 = iVar13 + 1) {
        ppIVar8 = ImVector<ImDrawList_*>::operator[]((pIVar5->DrawDataBuilder).Layers,iVar13);
        ShowMetricsWindow::Funcs::NodeDrawList((ImGuiWindow *)0x0,*ppIVar8,label);
      }
      TreePop();
    }
    bVar6 = TreeNode("Popups","Open Popups Stack (%d)",(ulong)(uint)(pIVar5->OpenPopupStack).Size);
    if (bVar6) {
      this = &pIVar5->OpenPopupStack;
      for (iVar13 = 0; iVar13 < this->Size; iVar13 = iVar13 + 1) {
        pvVar9 = ImVector<ImGuiPopupRef>::operator[](this,iVar13);
        pIVar4 = pvVar9->Window;
        pvVar9 = ImVector<ImGuiPopupRef>::operator[](this,iVar13);
        pcVar10 = "";
        pcVar11 = "NULL";
        pcVar12 = "";
        if (pIVar4 != (ImGuiWindow *)0x0) {
          pcVar11 = pIVar4->Name;
          pcVar10 = " ChildWindow";
          if (((uint)pIVar4->Flags >> 0x18 & 1) == 0) {
            pcVar10 = "";
          }
          pcVar12 = " ChildMenu";
          if (((uint)pIVar4->Flags >> 0x1c & 1) == 0) {
            pcVar12 = "";
          }
        }
        BulletText("PopupID: %08x, Window: \'%s\'%s%s",(ulong)pvVar9->PopupId,pcVar11,pcVar10,
                   pcVar12);
      }
      TreePop();
    }
    bVar6 = TreeNode("Internal state");
    if (bVar6) {
      pcVar10 = "NULL";
      pcVar11 = "NULL";
      if (pIVar5->HoveredWindow != (ImGuiWindow *)0x0) {
        pcVar11 = pIVar5->HoveredWindow->Name;
      }
      Text("HoveredWindow: \'%s\'",pcVar11);
      pcVar11 = "NULL";
      if (pIVar5->HoveredRootWindow != (ImGuiWindow *)0x0) {
        pcVar11 = pIVar5->HoveredRootWindow->Name;
      }
      Text("HoveredRootWindow: \'%s\'",pcVar11);
      Text("HoveredId: 0x%08X/0x%08X (%.2f sec)",(double)pIVar5->HoveredIdTimer,
           (ulong)pIVar5->HoveredId,(ulong)pIVar5->HoveredIdPreviousFrame);
      Text("ActiveId: 0x%08X/0x%08X (%.2f sec), ActiveIdSource: %s",(double)pIVar5->ActiveIdTimer,
           (ulong)pIVar5->ActiveId,(ulong)pIVar5->ActiveIdPreviousFrame,
           *(undefined8 *)(&DAT_001f8d60 + (ulong)pIVar5->ActiveIdSource * 8));
      pcVar11 = "NULL";
      if (pIVar5->ActiveIdWindow != (ImGuiWindow *)0x0) {
        pcVar11 = pIVar5->ActiveIdWindow->Name;
      }
      Text("ActiveIdWindow: \'%s\'",pcVar11);
      pcVar11 = "NULL";
      if (pIVar5->MovingWindow != (ImGuiWindow *)0x0) {
        pcVar11 = pIVar5->MovingWindow->Name;
      }
      Text("MovingWindow: \'%s\'",pcVar11);
      if (pIVar5->NavWindow != (ImGuiWindow *)0x0) {
        pcVar10 = pIVar5->NavWindow->Name;
      }
      Text("NavWindow: \'%s\'",pcVar10);
      Text("NavId: 0x%08X, NavLayer: %d",(ulong)pIVar5->NavId,(ulong)(uint)pIVar5->NavLayer);
      Text("NavInputSource: %s",*(undefined8 *)(&DAT_001f8d60 + (ulong)pIVar5->NavInputSource * 8));
      Text("NavActive: %d, NavVisible: %d",(ulong)(pIVar5->IO).NavActive,
           (ulong)(pIVar5->IO).NavVisible);
      Text("NavActivateId: 0x%08X, NavInputId: 0x%08X",(ulong)pIVar5->NavActivateId,
           (ulong)pIVar5->NavInputId);
      Text("NavDisableHighlight: %d, NavDisableMouseHover: %d",(ulong)pIVar5->NavDisableHighlight,
           (ulong)pIVar5->NavDisableMouseHover);
      Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)",
           (ulong)pIVar5->DragDropActive,(ulong)(pIVar5->DragDropPayload).SourceId,
           (pIVar5->DragDropPayload).DataType,(ulong)(uint)(pIVar5->DragDropPayload).DataSize);
      TreePop();
    }
  }
  End();
  return;
}

Assistant:

void ImGui::ShowMetricsWindow(bool* p_open)
{
    if (ImGui::Begin("ImGui Metrics", p_open))
    {
        static bool show_draw_cmd_clip_rects = true;
        ImGui::Text("Dear ImGui %s", ImGui::GetVersion());
        ImGui::Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / ImGui::GetIO().Framerate, ImGui::GetIO().Framerate);
        ImGui::Text("%d vertices, %d indices (%d triangles)", ImGui::GetIO().MetricsRenderVertices, ImGui::GetIO().MetricsRenderIndices, ImGui::GetIO().MetricsRenderIndices / 3);
        ImGui::Text("%d allocations", (int)GImAllocatorActiveAllocationsCount);
        ImGui::Checkbox("Show clipping rectangles when hovering draw commands", &show_draw_cmd_clip_rects);
        ImGui::Separator();

        struct Funcs
        {
            static void NodeDrawList(ImGuiWindow* window, ImDrawList* draw_list, const char* label)
            {
                bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
                if (draw_list == ImGui::GetWindowDrawList())
                {
                    ImGui::SameLine();
                    ImGui::TextColored(ImColor(255,100,100), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                    if (node_open) ImGui::TreePop();
                    return;
                }

                ImDrawList* overlay_draw_list = GetOverlayDrawList(); // Render additional visuals into the top-most draw list
                if (window && IsItemHovered())
                    overlay_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
                if (!node_open)
                    return;

                int elem_offset = 0;
                for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
                {
                    if (pcmd->UserCallback == NULL && pcmd->ElemCount == 0)
                        continue;
                    if (pcmd->UserCallback)
                    {
                        ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                        continue;
                    }
                    ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                    bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "Draw %4d %s vtx, tex 0x%p, clip_rect (%4.0f,%4.0f)-(%4.0f,%4.0f)", pcmd->ElemCount, draw_list->IdxBuffer.Size > 0 ? "indexed" : "non-indexed", pcmd->TextureId, pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                    if (show_draw_cmd_clip_rects && ImGui::IsItemHovered())
                    {
                        ImRect clip_rect = pcmd->ClipRect;
                        ImRect vtxs_rect;
                        for (int i = elem_offset; i < elem_offset + (int)pcmd->ElemCount; i++)
                            vtxs_rect.Add(draw_list->VtxBuffer[idx_buffer ? idx_buffer[i] : i].pos);
                        clip_rect.Floor(); overlay_draw_list->AddRect(clip_rect.Min, clip_rect.Max, IM_COL32(255,255,0,255));
                        vtxs_rect.Floor(); overlay_draw_list->AddRect(vtxs_rect.Min, vtxs_rect.Max, IM_COL32(255,0,255,255));
                    }
                    if (!pcmd_node_open)
                        continue;

                    // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
                    ImGuiListClipper clipper(pcmd->ElemCount/3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                    while (clipper.Step())
                        for (int prim = clipper.DisplayStart, vtx_i = elem_offset + clipper.DisplayStart*3; prim < clipper.DisplayEnd; prim++)
                        {
                            char buf[300];
                            char *buf_p = buf, *buf_end = buf + IM_ARRAYSIZE(buf);
                            ImVec2 triangles_pos[3];
                            for (int n = 0; n < 3; n++, vtx_i++)
                            {
                                ImDrawVert& v = draw_list->VtxBuffer[idx_buffer ? idx_buffer[vtx_i] : vtx_i];
                                triangles_pos[n] = v.pos;
                                buf_p += ImFormatString(buf_p, (int)(buf_end - buf_p), "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n", (n == 0) ? "vtx" : "   ", vtx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                            }
                            ImGui::Selectable(buf, false);
                            if (ImGui::IsItemHovered())
                            {
                                ImDrawListFlags backup_flags = overlay_draw_list->Flags;
                                overlay_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines at is more readable for very large and thin triangles.
                                overlay_draw_list->AddPolyline(triangles_pos, 3, IM_COL32(255,255,0,255), true, 1.0f);
                                overlay_draw_list->Flags = backup_flags;
                            }
                        }
                    ImGui::TreePop();
                }
                ImGui::TreePop();
            }

            static void NodeWindows(ImVector<ImGuiWindow*>& windows, const char* label)
            {
                if (!ImGui::TreeNode(label, "%s (%d)", label, windows.Size))
                    return;
                for (int i = 0; i < windows.Size; i++)
                    Funcs::NodeWindow(windows[i], "Window");
                ImGui::TreePop();
            }

            static void NodeWindow(ImGuiWindow* window, const char* label)
            {
                if (!ImGui::TreeNode(window, "%s '%s', %d @ 0x%p", label, window->Name, window->Active || window->WasActive, window))
                    return;
                ImGuiWindowFlags flags = window->Flags;
                NodeDrawList(window, window->DrawList, "DrawList");
                ImGui::BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), SizeContents (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->SizeContents.x, window->SizeContents.y);
                ImGui::BulletText("Flags: 0x%08X (%s%s%s%s%s%s..)", flags,
                    (flags & ImGuiWindowFlags_ChildWindow) ? "Child " : "", (flags & ImGuiWindowFlags_Tooltip)   ? "Tooltip "   : "", (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
                    (flags & ImGuiWindowFlags_Modal)       ? "Modal " : "", (flags & ImGuiWindowFlags_ChildMenu) ? "ChildMenu " : "", (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "");
                ImGui::BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f)", window->Scroll.x, GetScrollMaxX(window), window->Scroll.y, GetScrollMaxY(window));
                ImGui::BulletText("Active: %d, WriteAccessed: %d", window->Active, window->WriteAccessed);
                ImGui::BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
                ImGui::BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
                if (!window->NavRectRel[0].IsInverted())
                    ImGui::BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
                else
                    ImGui::BulletText("NavRectRel[0]: <None>");
                if (window->RootWindow != window) NodeWindow(window->RootWindow, "RootWindow");
                if (window->ParentWindow != NULL) NodeWindow(window->ParentWindow, "ParentWindow");
                if (window->DC.ChildWindows.Size > 0) NodeWindows(window->DC.ChildWindows, "ChildWindows");
                if (window->ColumnsStorage.Size > 0 && ImGui::TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
                {
                    for (int n = 0; n < window->ColumnsStorage.Size; n++)
                    {
                        const ImGuiColumnsSet* columns = &window->ColumnsStorage[n];
                        if (ImGui::TreeNode((void*)(uintptr_t)columns->ID, "Columns Id: 0x%08X, Count: %d, Flags: 0x%04X", columns->ID, columns->Count, columns->Flags))
                        {
                            ImGui::BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)", columns->MaxX - columns->MinX, columns->MinX, columns->MaxX);
                            for (int column_n = 0; column_n < columns->Columns.Size; column_n++)
                                ImGui::BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)", column_n, columns->Columns[column_n].OffsetNorm, OffsetNormToPixels(columns, columns->Columns[column_n].OffsetNorm));
                            ImGui::TreePop();
                        }
                    }
                    ImGui::TreePop();
                }
                ImGui::BulletText("Storage: %d bytes", window->StateStorage.Data.Size * (int)sizeof(ImGuiStorage::Pair));
                ImGui::TreePop();
            }
        };

        // Access private state, we are going to display the draw lists from last frame
        ImGuiContext& g = *GImGui;
        Funcs::NodeWindows(g.Windows, "Windows");
        if (ImGui::TreeNode("DrawList", "Active DrawLists (%d)", g.DrawDataBuilder.Layers[0].Size))
        {
            for (int i = 0; i < g.DrawDataBuilder.Layers[0].Size; i++)
                Funcs::NodeDrawList(NULL, g.DrawDataBuilder.Layers[0][i], "DrawList");
            ImGui::TreePop();
        }
        if (ImGui::TreeNode("Popups", "Open Popups Stack (%d)", g.OpenPopupStack.Size))
        {
            for (int i = 0; i < g.OpenPopupStack.Size; i++)
            {
                ImGuiWindow* window = g.OpenPopupStack[i].Window;
                ImGui::BulletText("PopupID: %08x, Window: '%s'%s%s", g.OpenPopupStack[i].PopupId, window ? window->Name : "NULL", window && (window->Flags & ImGuiWindowFlags_ChildWindow) ? " ChildWindow" : "", window && (window->Flags & ImGuiWindowFlags_ChildMenu) ? " ChildMenu" : "");
            }
            ImGui::TreePop();
        }
        if (ImGui::TreeNode("Internal state"))
        {
            const char* input_source_names[] = { "None", "Mouse", "Nav", "NavKeyboard", "NavGamepad" }; IM_ASSERT(IM_ARRAYSIZE(input_source_names) == ImGuiInputSource_COUNT);
            ImGui::Text("HoveredWindow: '%s'", g.HoveredWindow ? g.HoveredWindow->Name : "NULL");
            ImGui::Text("HoveredRootWindow: '%s'", g.HoveredRootWindow ? g.HoveredRootWindow->Name : "NULL");
            ImGui::Text("HoveredId: 0x%08X/0x%08X (%.2f sec)", g.HoveredId, g.HoveredIdPreviousFrame, g.HoveredIdTimer); // Data is "in-flight" so depending on when the Metrics window is called we may see current frame information or not
            ImGui::Text("ActiveId: 0x%08X/0x%08X (%.2f sec), ActiveIdSource: %s", g.ActiveId, g.ActiveIdPreviousFrame, g.ActiveIdTimer, input_source_names[g.ActiveIdSource]);
            ImGui::Text("ActiveIdWindow: '%s'", g.ActiveIdWindow ? g.ActiveIdWindow->Name : "NULL");
            ImGui::Text("MovingWindow: '%s'", g.MovingWindow ? g.MovingWindow->Name : "NULL");
            ImGui::Text("NavWindow: '%s'", g.NavWindow ? g.NavWindow->Name : "NULL");
            ImGui::Text("NavId: 0x%08X, NavLayer: %d", g.NavId, g.NavLayer);
            ImGui::Text("NavInputSource: %s", input_source_names[g.NavInputSource]);
            ImGui::Text("NavActive: %d, NavVisible: %d", g.IO.NavActive, g.IO.NavVisible);
            ImGui::Text("NavActivateId: 0x%08X, NavInputId: 0x%08X", g.NavActivateId, g.NavInputId);
            ImGui::Text("NavDisableHighlight: %d, NavDisableMouseHover: %d", g.NavDisableHighlight, g.NavDisableMouseHover);
            ImGui::Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)", g.DragDropActive, g.DragDropPayload.SourceId, g.DragDropPayload.DataType, g.DragDropPayload.DataSize);
            ImGui::TreePop();
        }
    }
    ImGui::End();
}